

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.c
# Opt level: O1

int demo_edit_proc(DEMO_MENU *item,int msg,int extra)

{
  char *__s;
  float fVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  int iVar7;
  undefined4 uVar8;
  float fVar9;
  undefined4 uVar10;
  undefined4 in_XMM1_Da;
  undefined4 uVar11;
  float fVar12;
  
  iVar5 = 1000;
  switch(msg) {
  case 1:
    uVar8 = al_map_rgb(0xff,0xff,(((uint)item->flags >> 1 & 1) != 0) + -1);
    uVar11 = in_XMM1_Da;
    iVar3 = demo_edit_proc(item,4,0);
    iVar4 = al_get_font_line_height(demo_data[1].dat);
    iVar7 = screen_width - iVar3;
    iVar2 = screen_width + iVar3;
    fVar9 = (float)(iVar4 + extra + 2);
    uVar10 = al_map_rgb(0,0,0);
    al_draw_filled_rectangle
              ((float)(iVar7 / 2 + -2),(float)(extra + -2),(float)(iVar2 / 2 + 2),fVar9,uVar10,
               uVar11);
    al_draw_rectangle((float)((screen_width - iVar3) / 2 + -2),(float)(extra + -2),
                      (float)((screen_width + iVar3) / 2 + 2),fVar9,uVar8,in_XMM1_Da,0x3f800000);
    shadow_textprintf((ALLEGRO_FONT *)demo_data[1].dat,screen_width / 2,extra,2,(int)item->name,
                      uVar8,in_XMM1_Da);
    iVar3 = screen_width;
    if ((item->flags & 2) != 0) {
      iVar2 = al_get_text_width(demo_data[1].dat,item->name);
      fVar1 = (float)((iVar2 + iVar3) / 2 + 2);
      fVar9 = fVar1 + 0.5;
      fVar12 = (float)(iVar4 + extra + -2);
      al_draw_line(fVar9,(float)(extra + 2),fVar9,fVar12,uVar8,in_XMM1_Da,0x3f800000);
      fVar1 = fVar1 + 1.5;
      al_draw_line(fVar1,(float)(extra + 2),fVar1,fVar12,uVar8,in_XMM1_Da,0x3f800000);
    }
    break;
  case 2:
    __s = item->name;
    sVar6 = strlen(__s);
    iVar3 = (int)sVar6;
    if (extra == 8) {
      if (iVar3 < 1) {
        return 1000;
      }
      __s[iVar3 - 1] = '\0';
    }
    else {
      if (0x5e < (extra & 0xffU) - 0x20) {
        return 1000;
      }
      if (item->extra <= iVar3) {
        return 1000;
      }
      __s[iVar3] = (char)extra;
    }
    if (item->on_activate != (_func_void_DEMO_MENU_ptr *)0x0) {
      (*item->on_activate)(item);
    }
    play_sound_id(7,0xff,0x80,-100,0);
    break;
  case 4:
    iVar3 = al_get_text_width(demo_data[1].dat,item->name);
    iVar5 = item->extra;
    iVar4 = al_get_text_width(demo_data[1].dat," ");
    if (iVar4 * iVar5 < iVar3) {
      iVar5 = al_get_text_width(demo_data[1].dat,item->name);
      return iVar5;
    }
    iVar3 = item->extra;
    iVar5 = al_get_text_width(demo_data[1].dat," ");
    iVar5 = iVar5 * iVar3;
    break;
  case 5:
    iVar5 = al_get_font_line_height(demo_data[1].dat);
    iVar5 = iVar5 + 8;
  }
  return iVar5;
}

Assistant:

int demo_edit_proc(DEMO_MENU * item, int msg, int extra)
{
   ALLEGRO_COLOR col;
   int w, h, x;
   int l, c;

   if (msg == DEMO_MENU_MSG_DRAW) {
      if (item->flags & DEMO_MENU_SELECTED) {
         col = al_map_rgb(255, 255, 0);
      } else {
         col = al_map_rgb(255, 255, 255);
      }

      w = demo_edit_proc(item, DEMO_MENU_MSG_WIDTH, 0);
      h = al_get_font_line_height(demo_font);

      al_draw_filled_rectangle((screen_width - w) / 2 - 2, extra - 2,
               (screen_width + w) / 2 + 2, extra + h + 2, al_map_rgb(0, 0, 0));
      al_draw_rectangle((screen_width - w) / 2 - 2, extra - 2,
           (screen_width + w) / 2 + 2, extra + h + 2, col, 1);
      shadow_textprintf(demo_font, screen_width / 2,
                      extra, col, 2, item->name);
      if (item->flags & DEMO_MENU_SELECTED) {
         x = (screen_width + al_get_text_width(demo_font, item->name)) / 2 + 2;
         al_draw_line(x + 0.5, extra + 2, x + 0.5, extra + h - 2, col, 1);
         al_draw_line(x + 1.5, extra + 2, x + 1.5, extra + h - 2, col, 1);
      }
   } else if (msg == DEMO_MENU_MSG_CHAR) {
      switch (extra) {
         case 8:
            l = strlen(item->name);
            if (l > 0) {
               item->name[l - 1] = 0;

               if (item->on_activate) {
                  item->on_activate(item);
               }

               play_sound_id(DEMO_SAMPLE_BUTTON, 255, 128, -freq_variation, 0);
            }
            break;

         default:
            l = strlen(item->name);
            c = extra & 0xff;
            if (l < item->extra && c >= 0x20 && c < 0x7f) {
               item->name[l] = c;

               if (item->on_activate) {
                  item->on_activate(item);
               }

               play_sound_id(DEMO_SAMPLE_BUTTON, 255, 128, -freq_variation, 0);
            }
            break;
      }
   } else if (msg == DEMO_MENU_MSG_WIDTH) {
      return MAX(al_get_text_width(demo_font, item->name),
                 item->extra * al_get_text_width(demo_font, " "));
   } else if (msg == DEMO_MENU_MSG_HEIGHT) {
      return al_get_font_line_height(demo_font) + 8;
   }

   return DEMO_MENU_CONTINUE;
}